

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

void * mi_heap_mallocn(mi_heap_t *heap,size_t count,size_t size)

{
  long lVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  void *pvVar6;
  
  if ((count == 1) ||
     (auVar3._8_8_ = 0, auVar3._0_8_ = count, auVar4._8_8_ = 0, auVar4._0_8_ = size,
     size = SUB168(auVar3 * auVar4,0), SUB168(auVar3 * auVar4,8) == 0)) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
    size = 0xffffffffffffffff;
  }
  if (!bVar5) {
    if (size < 0x401) {
      lVar1 = *(long *)((long)heap->pages_free_direct + (size + 7 & 0xfffffffffffffff8));
      puVar2 = *(undefined8 **)(lVar1 + 0x10);
      if (puVar2 != (undefined8 *)0x0) {
        *(undefined8 *)(lVar1 + 0x10) = *puVar2;
        *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
        return puVar2;
      }
    }
    pvVar6 = _mi_malloc_generic(heap,size,false,0);
    return pvVar6;
  }
  return (void *)0x0;
}

Assistant:

static inline bool mi_count_size_overflow(size_t count, size_t size, size_t* total) {
  if (count==1) {  // quick check for the case where count is one (common for C++ allocators)
    *total = size;
    return false;
  }
  else if mi_unlikely(mi_mul_overflow(count, size, total)) {
    #if MI_DEBUG > 0
    _mi_error_message(EOVERFLOW, "allocation request is too large (%zu * %zu bytes)\n", count, size);
    #endif
    *total = SIZE_MAX;
    return true;
  }
  else return false;
}